

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafill.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_30;
  int local_2c;
  int32_t i;
  int32_t v;
  int32_t b;
  int32_t a;
  int cnum;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _cnum = argv;
  argv_local._0_4_ = argc;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    b = 0;
    while (a = getopt((int)argv_local,_cnum,"c:"), a != -1) {
      if (a == 99) {
        __isoc99_sscanf(_optarg,"%d",&b);
      }
    }
    if (b < nva_cardsnum) {
      i = 4;
      local_2c = 0;
      if (_optind < (int)argv_local) {
        __isoc99_sscanf(_cnum[_optind],"%x",&v);
        if (_optind + 1 < (int)argv_local) {
          __isoc99_sscanf(_cnum[_optind + 1],"%x",&i);
        }
        if (_optind + 2 < (int)argv_local) {
          __isoc99_sscanf(_cnum[_optind + 2],"%x",&local_2c);
        }
        for (local_30 = 0; local_30 < i; local_30 = local_30 + 4) {
          nva_wr32(b,v + local_30,local_2c + local_30);
        }
        argv_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"No address specified.\n");
        argv_local._4_4_ = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, v = 0, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	if (optind + 2 < argc)
		sscanf (argv[optind + 2], "%x", &v);
	for (i = 0; i < b; i += 4) {
		nva_wr32(cnum, a+i, v+i);
	}
	return 0;
}